

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode *
CTcPrsOpUnary::parse_embedded_if(CTcEmbedBuilder *b,int unless,int *eos,CTcEmbedLevel *parent)

{
  int iVar1;
  tc_toktyp_t tVar2;
  CTcPrsNode *pCVar3;
  CTcPrsNode *pCVar4;
  CTcPrsNode *pCVar5;
  undefined4 extraout_var;
  CTcPrsNode *pCVar6;
  CTcPrsNode *pCVar7;
  CTcTokenizer *this;
  bool bVar8;
  CTcEmbedLevel level;
  CTcEmbedLevel local_48;
  _func_int **local_38;
  
  local_48.typ = 1;
  local_48.parent = parent;
  pCVar3 = CTcParser::parse_cond_expr((CTcParser *)b);
  if (pCVar3 != (CTcPrsNode *)0x0) {
    pCVar4 = pCVar3;
    if (unless != 0) {
      pCVar4 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x10);
      pCVar4[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar3;
      (pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0031d3d8;
    }
    pCVar3 = parse_embedding_list(b,eos,&local_48);
    bVar8 = false;
    if (pCVar3 != (CTcPrsNode *)0x0) {
      pCVar5 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x20);
      pCVar5[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar4;
      pCVar5[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar3;
      pCVar5[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)0x0;
      (pCVar5->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0031f9f0;
      pCVar3 = pCVar5;
      if (*eos == 0) {
        local_38 = (_func_int **)&PTR_gen_code_0031d3d8;
        do {
          if (((G_tok->curtok_).typ_ != TOKT_ELSE) &&
             (iVar1 = CTcTokenizer::cur_tok_matches(G_tok,"otherwise",9), pCVar4 = pCVar3,
             iVar1 == 0)) break;
          tVar2 = CTcTokenizer::next(G_tok);
          if ((tVar2 != TOKT_IF) &&
             (iVar1 = CTcTokenizer::cur_tok_matches(G_tok,"unless",6), iVar1 == 0)) {
            pCVar4 = parse_embedding_list(b,eos,&local_48);
            bVar8 = pCVar4 != (CTcPrsNode *)0x0;
            if (!bVar8) {
              return (CTcPrsNode *)0x0;
            }
            pCVar3[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar4;
            goto LAB_001fe836;
          }
          tVar2 = (G_tok->curtok_).typ_;
          this = G_tok;
          CTcTokenizer::next(G_tok);
          pCVar4 = CTcParser::parse_cond_expr((CTcParser *)this);
          if (pCVar4 == (CTcPrsNode *)0x0) {
            return (CTcPrsNode *)0x0;
          }
          pCVar6 = pCVar4;
          if (tVar2 != TOKT_IF) {
            pCVar6 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x10);
            pCVar6[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar4;
            (pCVar6->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = local_38;
          }
          pCVar7 = parse_embedding_list(b,eos,&local_48);
          if (pCVar7 == (CTcPrsNode *)0x0) {
            return (CTcPrsNode *)0x0;
          }
          pCVar4 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x20);
          pCVar4[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar6;
          pCVar4[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar7;
          pCVar4[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)0x0;
          (pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_0031f9f0
          ;
          pCVar3[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)pCVar4;
          pCVar3 = pCVar4;
        } while (*eos == 0);
        bVar8 = false;
        pCVar3 = pCVar4;
      }
LAB_001fe836:
      if (!bVar8) {
        iVar1 = (*b->_vptr_CTcEmbedBuilder[2])(b,0);
        pCVar3[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
             (_func_int **)CONCAT44(extraout_var,iVar1);
      }
      if (*eos == 0) {
        iVar1 = CTcTokenizer::cur_tok_matches(G_tok,"end",3);
        if (iVar1 != 0) {
          CTcTokenizer::next(G_tok);
          return pCVar5;
        }
        return pCVar5;
      }
      return pCVar5;
    }
  }
  return (CTcPrsNode *)0x0;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_embedded_if(
    CTcEmbedBuilder *b, int unless, int &eos, CTcEmbedLevel *parent)
{
    /* set up our embedding stack level */
    CTcEmbedLevel level(CTcEmbedLevel::If, parent);

    /* parse the condition expression */
    CTcPrsNode *cond = G_prs->parse_cond_expr();
    if (cond == 0)
        return 0;

    /* if this is an "unless", invert the condition */
    if (unless)
        cond = new CTPNNot(cond);
    
    /* parse the "then" list */
    CTcPrsNode *then = parse_embedding_list(b, eos, &level);
    if (then == 0)
        return 0;

    /* 
     *   create our top-level 'if' node - leave the 'else' branch empty for
     *   now; we'll build this out if we find an 'else' 
     */
    CTPNIf *top = new CTPNIf(cond, then, 0);

    /* 
     *   as we build out the 'else if' branches, we'll add elses to the tail
     *   of the tree; this is currently the top node 
     */
    CTPNIf *tail = top;

    /* parse zero or more "else if" branches */
    int found_else = FALSE;
    while (!eos
           && (G_tok->cur() == TOKT_ELSE
               || G_tok->cur_tok_matches("otherwise")))
    {
        /* skip the "else"/"otherwise", and check for another "if" */
        if (G_tok->next() == TOKT_IF || G_tok->cur_tok_matches("unless"))
        {
            /* 
             *   <<else if cond>> or <<else unless cond>>.  Note which sense
             *   of the test we're using.
             */
            unless = (G_tok->cur() != TOKT_IF);

            /* skip the "else"/"otherwise" and parse the condition */
            G_tok->next();
            cond = G_prs->parse_cond_expr();
            if (cond == 0)
                return 0;

            /* if it's 'unless', invert the condition */
            if (unless)
                cond = new CTPNNot(cond);

            /* parse the "then" list for this new branch */
            then = parse_embedding_list(b, eos, &level);
            if (then == 0)
                return 0;

            /* add the new 'if' node to the 'else' of the tail of the tree */
            CTPNIf *sub = new CTPNIf(cond, then, 0);
            tail->set_else(sub);

            /* this is the new tail, for adding the next 'else' */
            tail = sub;
        }
        else
        {
            /* it's the final else/otherwise - parse the branch */
            CTcPrsNode *sub = parse_embedding_list(b, eos, &level);
            if (sub == 0)
                return 0;

            /* add it as the else branch of the tail node of the tree */
            tail->set_else(sub);

            /* no more clauses of the "if" can follow an "else" */
            found_else = TRUE;
            break;
        }
    }

    /* 
     *   if we ended without an "else", add an implicit "nil" as the final
     *   "else" branch 
     */
    if (!found_else)
        tail->set_else(b->finish_tree(0));

    /* 
     *   If we're at an "end" token, this is the explicit close of the "if".
     *   Otherwise, the "if" ended implicitly at the end of the string or at
     *   a closing token for a containing structure. 
     */
    if (!eos && G_tok->cur_tok_matches("end"))
        G_tok->next();

    /* return the condition tree */
    return top;
}